

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

void auto_tile_size_balancing(AV1_COMMON *cm,int num_sbs,int num_tiles_lg,int tile_col_row)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  (cm->tiles).uniform_spacing = 0;
  if (num_sbs < 1) {
    uVar9 = 0;
  }
  else {
    bVar3 = (byte)num_tiles_lg;
    uVar5 = (uint)num_sbs >> (bVar3 & 0x1f);
    iVar7 = uVar5 << (bVar3 & 0x1f);
    uVar1 = (cm->tiles).max_width_sb;
    piVar4 = (cm->tiles).col_start_sb;
    if (tile_col_row == 0) {
      piVar4 = (cm->tiles).row_start_sb;
    }
    iVar6 = 0;
    uVar8 = 0;
    do {
      uVar5 = ((uint)(iVar7 + ((1 << (bVar3 & 0x1f)) - num_sbs)) == uVar8) + uVar5;
      uVar2 = uVar1;
      if ((int)uVar5 < (int)uVar1) {
        uVar2 = uVar5;
      }
      piVar4[uVar8] = iVar6;
      iVar6 = uVar2 + iVar6;
      uVar9 = uVar8 + 1;
    } while ((iVar6 < num_sbs) && (bVar10 = uVar8 < 0x3f, uVar8 = uVar9, bVar10));
  }
  (cm->tiles).col_start_sb[(ulong)(tile_col_row == 0) - 0xf] = (int)uVar9;
  piVar4 = (cm->tiles).col_start_sb;
  if (tile_col_row == 0) {
    piVar4 = (cm->tiles).row_start_sb;
  }
  piVar4[uVar9 & 0xffffffff] = num_sbs;
  return;
}

Assistant:

static void auto_tile_size_balancing(AV1_COMMON *const cm, int num_sbs,
                                     int num_tiles_lg, int tile_col_row) {
  CommonTileParams *const tiles = &cm->tiles;
  int i, start_sb;
  int size_sb = num_sbs >> num_tiles_lg;
  int res_sbs = num_sbs - (size_sb << num_tiles_lg);
  int num_tiles = 1 << num_tiles_lg;
  int inc_index = num_tiles - res_sbs;

  tiles->uniform_spacing = 0;

  for (i = 0, start_sb = 0; start_sb < num_sbs && i < MAX_TILE_COLS; ++i) {
    if (i == inc_index) ++size_sb;
    if (tile_col_row)
      tiles->col_start_sb[i] = start_sb;
    else
      tiles->row_start_sb[i] = start_sb;

    start_sb += AOMMIN(size_sb, tiles->max_width_sb);
  }

  if (tile_col_row) {
    tiles->cols = i;
    tiles->col_start_sb[i] = num_sbs;
  } else {
    tiles->rows = i;
    tiles->row_start_sb[i] = num_sbs;
  }
}